

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param(Net *this,uchar *_mem)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer plVar4;
  layer_creator_func p_Var5;
  pointer pBVar6;
  iterator __position;
  pointer piVar7;
  int *piVar8;
  void *__ptr;
  long *plVar9;
  int iVar10;
  Layer *pLVar11;
  long lVar12;
  size_type sVar13;
  ParamDict pd;
  int local_604;
  uint *local_600;
  Net *local_5f8;
  uchar *local_5f0;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_5e8;
  size_type local_5e0;
  Layer *local_5d8;
  ParamDict local_5d0;
  
  local_5f8 = this;
  if (((ulong)_mem & 3) == 0) {
    if (*(int *)_mem == 0x7685dd) {
      sVar13 = (size_type)*(int *)(_mem + 4);
      iVar10 = *(int *)(_mem + 8);
      local_600 = (uint *)(_mem + 0xc);
      local_5e8 = &this->layers;
      local_5f0 = _mem;
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_5e8,sVar13);
      this_00 = &this->blobs;
      std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)iVar10);
      ParamDict::ParamDict(&local_5d0);
      local_604 = 0;
      local_5e0 = sVar13;
      if (0 < (long)sVar13) {
        do {
          uVar1 = *local_600;
          uVar2 = local_600[1];
          uVar3 = local_600[2];
          local_600 = local_600 + 3;
          pLVar11 = create_layer(uVar1);
          if (pLVar11 == (Layer *)0x0) {
            if (-1 < (int)uVar1) {
              plVar4 = (local_5f8->custom_layer_registry).
                       super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((((int)(uVar1 & 0xfffffeff) <
                    (int)((ulong)((long)(local_5f8->custom_layer_registry).
                                        super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)plVar4)
                         >> 4)) &&
                  (p_Var5 = plVar4[uVar1 & 0xfffffeff].creator, p_Var5 != (layer_creator_func)0x0))
                 && (pLVar11 = (*p_Var5)(), pLVar11 != (Layer *)0x0)) goto LAB_00123215;
            }
            fprintf(_stderr,"layer %d not exists or registered\n",(ulong)uVar1);
            clear(local_5f8);
            iVar10 = -1;
            goto LAB_0012333d;
          }
LAB_00123215:
          std::vector<int,_std::allocator<int>_>::resize(&pLVar11->bottoms,(long)(int)uVar2);
          local_5d8 = pLVar11;
          if (0 < (int)uVar2) {
            sVar13 = 0;
            do {
              uVar1 = *local_600;
              local_600 = local_600 + 1;
              pBVar6 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              __position._M_current =
                   pBVar6[(int)uVar1].consumers.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  pBVar6[(int)uVar1].consumers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&pBVar6[(int)uVar1].consumers,
                           __position,&local_604);
              }
              else {
                *__position._M_current = local_604;
                pBVar6[(int)uVar1].consumers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              (pLVar11->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[sVar13] = uVar1;
              sVar13 = sVar13 + 1;
            } while ((long)(int)uVar2 != sVar13);
          }
          pLVar11 = local_5d8;
          this_01 = &local_5d8->tops;
          std::vector<int,_std::allocator<int>_>::resize(this_01,(long)(int)uVar3);
          if (0 < (int)uVar3) {
            pBVar6 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar7 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = 0;
            do {
              iVar10 = *(int *)((long)local_600 + lVar12);
              pBVar6[iVar10].producer = local_604;
              *(int *)((long)piVar7 + lVar12) = iVar10;
              lVar12 = lVar12 + 4;
            } while ((long)(int)uVar3 * 4 != lVar12);
            local_600 = (uint *)((long)local_600 + lVar12);
          }
          iVar10 = ParamDict::load_param(&local_5d0,(uchar **)&local_600);
          if (iVar10 == 0) {
            iVar10 = (*pLVar11->_vptr_Layer[2])(pLVar11,&local_5d0);
            if (iVar10 == 0) {
              (local_5e8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
              .super__Vector_impl_data._M_start[local_604] = pLVar11;
            }
            else {
              load_param();
            }
          }
          else {
            load_param();
          }
          local_604 = local_604 + 1;
        } while (local_604 < (int)local_5e0);
      }
      iVar10 = (int)local_600 - (int)local_5f0;
LAB_0012333d:
      lVar12 = 0x560;
      do {
        piVar8 = *(int **)((long)&local_5d0.params[0].v.data + lVar12);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            __ptr = *(void **)((long)&local_5d0.params[0].loaded + lVar12);
            plVar9 = *(long **)((long)&local_5d0.params[0].v.packing + lVar12);
            if (plVar9 == (long *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)(*plVar9 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar12 + 4) = 0;
        *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar12) = 0;
        *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar12) = 0;
        *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar12) = 0;
        *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar12) = 0;
        *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar12) = 0;
        lVar12 = lVar12 + -0x48;
      } while (lVar12 != -0x40);
      return iVar10;
    }
    load_param();
  }
  else {
    fprintf(_stderr,"memory not 32-bit aligned at %p\n");
  }
  return -1;
}

Assistant:

int Net::load_param(const unsigned char* _mem)
{
    if ((unsigned long)_mem & 0x3)
    {
        // reject unaligned memory
        fprintf(stderr, "memory not 32-bit aligned at %p\n", _mem);
        return -1;
    }

    const unsigned char* mem = _mem;

    int magic = *(int*)(mem);
    mem += 4;

    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = *(int*)(mem);
    mem += 4;

    int blob_count = *(int*)(mem);
    mem += 4;

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (use_vulkan_compute && !vkdev)
    {
        // use default vulkan device
        if (!vkdev_local)
            vkdev_local = new VulkanDevice;
        vkdev = vkdev_local;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex = *(int*)mem;
        mem += 4;

        int bottom_count = *(int*)mem;
        mem += 4;

        int top_count = *(int*)mem;
        mem += 4;

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index = *(int*)mem;
            mem += 4;

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index = *(int*)mem;
            mem += 4;

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param(mem);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

    return mem - _mem;
}